

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O0

void __thiscall
BsplineCurve::BsplineCurve(BsplineCurve *this,vector<vec3f,_std::allocator<vec3f>_> *points)

{
  size_type sVar1;
  undefined8 *puVar2;
  pointer in_RSI;
  vector<vec3f,_std::allocator<vec3f>_> *in_RDI;
  vector<vec3f,_std::allocator<vec3f>_> *in_stack_00000008;
  vector<vec3f,_std::allocator<vec3f>_> *in_stack_00000010;
  Curve *this_00;
  vector<vec3f,_std::allocator<vec3f>_> *in_stack_ffffffffffffffd0;
  Curve local_28;
  
  this_00 = &local_28;
  local_28.controls.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_RSI;
  std::vector<vec3f,_std::allocator<vec3f>_>::vector(in_stack_00000010,in_stack_00000008);
  Curve::Curve(this_00,in_RDI);
  std::vector<vec3f,_std::allocator<vec3f>_>::~vector(in_stack_ffffffffffffffd0);
  (in_RDI->super__Vector_base<vec3f,_std::allocator<vec3f>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR_atParam_001e7f98;
  sVar1 = std::vector<vec3f,_std::allocator<vec3f>_>::size
                    ((vector<vec3f,_std::allocator<vec3f>_> *)
                     local_28.controls.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (sVar1 < 4) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "Number of control points of BspineCurve must be more than 4!";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  return;
}

Assistant:

BsplineCurve(const std::vector<vec3f> &points) : Curve(points) {
        if (points.size() < 4) {
            throw "Number of control points of BspineCurve must be more than 4!";
        }
    }